

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O1

void store_mf(int fd,memfile *mf)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  
  iVar1 = mf->pos;
  for (iVar3 = iVar1; iVar3 != 0; iVar3 = iVar3 - (int)sVar2) {
    sVar2 = write(fd,mf->buf + (iVar1 - iVar3),(long)iVar3);
    if ((int)sVar2 == -1) break;
  }
  mfree(mf);
  *(undefined8 *)((long)&mf->diffbuf + 4) = 0;
  mf->diffpos = 0;
  mf->relativepos = 0;
  mf->relativeto = (memfile *)0x0;
  mf->diffbuf = (char *)0x0;
  mf->buf = (char *)0x0;
  mf->len = 0;
  mf->pos = 0;
  mf->curcmd = MDIFF_INVALID;
  memset(mf->tags,0,0x1f88);
  return;
}

Assistant:

void store_mf(int fd, struct memfile *mf)
{
	int len, left, ret;
	
	len = left = mf->pos;
	while (left) {
	    ret = write(fd, &mf->buf[len - left], left);
	    if (ret == -1) /* error */
		goto out;
	    left -= ret;
	}

out:
	mfree(mf);
	mnew(mf, NULL);
}